

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 float32_to_floatx80_riscv64(float32 a,float_status *status)

{
  int iVar1;
  float32 a_00;
  uint uVar2;
  undefined8 extraout_RDX;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  floatx80 fVar6;
  commonNaNT local_28;
  
  a_00 = float32_squash_input_denormal_riscv64(a,status);
  uVar4 = a_00 & 0x7fffff;
  iVar1 = (int)a_00 >> 0x1f;
  if ((char)(a_00 >> 0x17) == '\0') {
    if (uVar4 == 0) {
      uVar3 = (ulong)(uint)(iVar1 * -0x8000);
      uVar5 = 0;
      goto LAB_00a8274a;
    }
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar4 = uVar4 << ((char)(uVar2 ^ 0x1f) - 8U & 0x1f);
    uVar2 = 9 - (uVar2 ^ 0x1f);
  }
  else {
    uVar2 = a_00 >> 0x17 & 0xff;
    if (uVar2 == 0xff) {
      if (uVar4 == 0) {
        uVar3 = (ulong)(iVar1 * -0x8000 | 0x7fff);
        uVar5 = 0x8000000000000000;
      }
      else {
        uVar5 = 0xc000000000000000;
        float32ToCommonNaN(&local_28,a_00,status);
        uVar3 = CONCAT62((int6)((ulong)extraout_RDX >> 0x10),0xffff);
        if ((status->default_nan_mode == '\0') && (1 < local_28.high)) {
          uVar5 = local_28.high >> 1 | 0x8000000000000000;
          uVar3 = (ulong)(local_28._0_4_ << 0xf | 0x7fff);
        }
      }
      goto LAB_00a8274a;
    }
  }
  uVar5 = (ulong)(uVar4 | 0x800000) << 0x28;
  uVar3 = (ulong)(iVar1 * -0x8000 + uVar2 + 0x3f80);
LAB_00a8274a:
  fVar6._8_8_ = uVar3;
  fVar6.low = uVar5;
  return fVar6;
}

Assistant:

floatx80 float32_to_floatx80(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    if ( aExp == 0xFF ) {
        if (aSig) {
            return commonNaNToFloatx80(float32ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    aSig |= 0x00800000;
    return packFloatx80( aSign, aExp + 0x3F80, ( (uint64_t) aSig )<<40 );

}